

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiply.hpp
# Opt level: O2

char duckdb::DecimalMultiplyOverflowCheck::Operation<signed_char,signed_char,signed_char>
               (char left,char right)

{
  OutOfRangeException *this;
  bool bVar1;
  char result;
  allocator local_41;
  string local_40;
  
  bVar1 = TryDecimalMultiply::Operation<signed_char,signed_char,signed_char>(left,right,&result);
  if (bVar1) {
    return result;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_40,
             "Overflow in multiplication of DECIMAL(18) (%d * %d). You might want to add an explicit cast to a bigger decimal."
             ,&local_41);
  OutOfRangeException::OutOfRangeException<signed_char,signed_char>(this,&local_40,left,right);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA left, TB right) {
		TR result;
		if (!TryDecimalMultiply::Operation<TA, TB, TR>(left, right, result)) {
			throw OutOfRangeException("Overflow in multiplication of DECIMAL(18) (%d * %d). You might want to add an "
			                          "explicit cast to a bigger decimal.",
			                          left, right);
		}
		return result;
	}